

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O3

int __thiscall Fl_Menu_Item::measure(Fl_Menu_Item *this,int *hp,Fl_Menu_ *m)

{
  uint uVar1;
  int w;
  int h;
  int local_48 [2];
  Fl_Label local_40;
  
  local_40.value = this->text;
  local_40.image = (Fl_Image *)0x0;
  local_40.deimage = (Fl_Image *)0x0;
  local_40.type = this->labeltype_;
  local_40.font = this->labelfont_;
  local_40.size = this->labelsize_;
  if (local_40.size == 0 && local_40.font == 0) {
    if (m == (Fl_Menu_ *)0x0) {
      local_40.font = 0;
    }
    else {
      local_40.font = m->textfont_;
    }
  }
  else if (local_40.size != 0) goto LAB_001bd62e;
  local_40.size = FL_NORMAL_SIZE;
  if (m != (Fl_Menu_ *)0x0) {
    local_40.size = m->textsize_;
  }
LAB_001bd62e:
  local_40.color = 0;
  fl_draw_shortcut = '\x01';
  local_48[0] = 0;
  local_48[1] = 0;
  if (hp == (int *)0x0) {
    hp = local_48 + 1;
  }
  Fl_Label::measure(&local_40,local_48,hp);
  fl_draw_shortcut = '\0';
  uVar1 = this->flags & 10;
  if (uVar1 != 0) {
    uVar1 = FL_NORMAL_SIZE;
  }
  return uVar1 + local_48[0];
}

Assistant:

int Fl_Menu_Item::measure(int* hp, const Fl_Menu_* m) const {
  Fl_Label l;
  l.value   = text;
  l.image   = 0;
  l.deimage = 0;
  l.type    = labeltype_;
  l.font    = labelsize_ || labelfont_ ? labelfont_ : (m ? m->textfont() : FL_HELVETICA);
  l.size    = labelsize_ ? labelsize_ : m ? m->textsize() : FL_NORMAL_SIZE;
  l.color   = FL_FOREGROUND_COLOR; // this makes no difference?
  fl_draw_shortcut = 1;
  int w = 0; int h = 0;
  l.measure(w, hp ? *hp : h);
  fl_draw_shortcut = 0;
  if (flags & (FL_MENU_TOGGLE|FL_MENU_RADIO)) w += FL_NORMAL_SIZE;
  return w;
}